

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O2

int YP_md_wheel_vel(YPSpur *spur,double r,double l)

{
  int iVar1;
  YPSpur_msg msg;
  
  msg.msg_type = 1;
  msg.pid = (long)spur->pid;
  msg.type = 0x23;
  msg.data[0] = r;
  msg.data[1] = l;
  iVar1 = (*(spur->dev).send)(&spur->dev,&msg);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int YP_md_wheel_vel(YPSpur* spur, double r, double l)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_WHEEL_VEL;
  msg.data[0] = r;
  msg.data[1] = l;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}